

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void duckdb_je_arena_cache_bin_fill_small
               (tsdn_t *tsdn,arena_t *arena,cache_bin_t *cache_bin,szind_t binind,
               cache_bin_sz_t nfill)

{
  size_t *psVar1;
  uint64_t *puVar2;
  atomic_zu_t *paVar3;
  pac_decay_stats_t *ppVar4;
  locked_u64_t *plVar5;
  pac_stats_t *ppVar6;
  pa_shard_stats_t *ppVar7;
  arena_t *arena_00;
  pthread_mutex_t *__mutex;
  batcher_t *batcher;
  char cVar8;
  int iVar9;
  void **ppvVar10;
  arena_t *arena_01;
  edata_t *peVar11;
  edata_t *peVar12;
  bool bVar13;
  bool bVar14;
  _Bool _Var15;
  int iVar16;
  uint uVar17;
  size_t sVar18;
  ulong uVar19;
  uint64_t uVar20;
  ulong uVar21;
  bin_t *extraout_RDX;
  bin_t *extraout_RDX_00;
  bin_t *extraout_RDX_01;
  bin_t *extraout_RDX_02;
  bin_t *pbVar22;
  bin_t *extraout_RDX_03;
  bin_t *extraout_RDX_04;
  bin_t *extraout_RDX_05;
  bin_t *extraout_RDX_06;
  ulong uVar23;
  uint cnt;
  bin_t *bin_info;
  arena_t *tsdn_00;
  undefined6 in_register_00000082;
  long *plVar24;
  mutex_prof_data_t *data;
  ulong uVar25;
  bool bVar26;
  edata_t *local_230;
  uint local_224;
  uint local_220;
  long local_1c8;
  undefined8 auStack_1c0 [8];
  uint local_180;
  edata_t *local_178;
  long local_170;
  void *local_168;
  long local_160;
  size_t local_158;
  long local_150;
  size_t local_148;
  ulong local_140;
  long local_138 [33];
  
  uVar21 = (ulong)binind;
  ppvVar10 = cache_bin->stack_head;
  iVar9 = *(int *)&cache_bin->low_bits_empty;
  local_224 = 0;
  if ((tsdn != (tsdn_t *)0x0) &&
     ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena != (arena_t *)0x0)) {
    local_224 = (uint)(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_binshards.
                      binshard[uVar21];
  }
  bin_info = (bin_t *)(duckdb_je_bin_infos + uVar21);
  local_170 = -(CONCAT62(in_register_00000082,nfill) & 0xffffffff);
  uVar17 = duckdb_je_arena_bin_offsets[uVar21];
  uVar23 = (ulong)(local_224 << 8);
  if (binind < duckdb_je_bin_info_nbatched_sizes) {
    uVar23 = (ulong)local_224 * 0x288;
  }
  arena_00 = (arena_t *)((long)&arena->nthreads[0].repr + uVar23 + uVar17);
  __mutex = (pthread_mutex_t *)
            ((long)&((atomic_zu_t *)(arena->nthreads + 0x12))->repr + uVar17 + uVar23);
  local_150 = uVar21 * 0x28 + 0x273b290;
  batcher = (batcher_t *)((long)&(arena->stats).mutex_prof_data[0].max_n_thds + uVar23 + uVar17);
  local_168 = (void *)((long)&(arena->stats).mutex_prof_data[2].n_owner_switches + uVar23 + uVar17);
  bVar14 = true;
  uVar23 = 0;
  local_230 = (edata_t *)0x0;
  do {
    iVar16 = pthread_mutex_trylock(__mutex);
    pbVar22 = extraout_RDX;
    if (iVar16 != 0) {
      duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)arena_00);
      *(undefined1 *)&(arena_00->stats).mapped = 1;
      pbVar22 = extraout_RDX_00;
    }
    psVar1 = &(arena_00->stats).metadata_thp;
    *psVar1 = *psVar1 + 1;
    if ((tsdn_t *)(arena_00->stats).resident != tsdn) {
      (arena_00->stats).resident = (size_t)tsdn;
      psVar1 = &(arena_00->stats).metadata_rtree;
      *psVar1 = *psVar1 + 1;
    }
    if (binind < duckdb_je_bin_info_nbatched_sizes) {
      uVar17 = duckdb_je_arena_binind_div_info[uVar21].magic;
      local_1c8 = 0;
      local_180 = 0;
      local_178 = (edata_t *)0x0;
      sVar18 = duckdb_je_batcher_pop_begin(tsdn,batcher);
      pbVar22 = extraout_RDX_01;
      if (sVar18 != 0xffffffffffffffff) {
        local_148 = duckdb_je_batcher_pop_get_pushes(tsdn,batcher);
        if (sVar18 != 0) {
          switchD_015ff80e::default(local_138,local_168,sVar18 << 4);
        }
        tsdn_00 = (arena_t *)tsdn;
        batcher_pop_end(tsdn,batcher);
        local_1c8 = 0;
        pbVar22 = extraout_RDX_02;
        if (sVar18 != 0) {
          local_220 = local_180;
          local_160 = 0;
          local_140 = (ulong)uVar17;
          local_158 = sVar18;
          plVar24 = local_138 + 1;
          do {
            arena_01 = (arena_t *)*plVar24;
            uVar19 = (plVar24[-1] - *(long *)&arena_01->binshard_next) * local_140;
            pbVar22 = (bin_t *)(1L << ((byte)(uVar19 >> 0x20) & 0x3f));
            *(ulong *)(arena_01->nthreads + (uVar19 >> 0x26) * 2 + 0x10) =
                 *(ulong *)(arena_01->nthreads + (uVar19 >> 0x26) * 2 + 0x10) ^ (ulong)pbVar22;
            uVar19 = *(long *)arena_01->nthreads + 0x10000000;
            *(ulong *)arena_01->nthreads = uVar19;
            uVar17 = (uint)(uVar19 >> 0x1c) & 0x3ff;
            if (uVar17 == duckdb_je_bin_infos[uVar21].nregs) {
              duckdb_je_arena_dalloc_bin_locked_handle_newly_empty
                        ((tsdn_t *)tsdn_00,arena,(edata_t *)arena_01,(bin_t *)arena_00);
              pbVar22 = extraout_RDX_03;
              if (local_220 < 8) {
                auStack_1c0[local_220] = arena_01;
                local_220 = local_220 + 1;
              }
              else {
                (arena_01->stats).metadata_rtree = (size_t)arena_01;
                (arena_01->stats).resident = (size_t)arena_01;
                if (local_178 != (edata_t *)0x0) {
                  (arena_01->stats).metadata_rtree =
                       (size_t)(local_178->field_5).ql_link_active.qre_prev;
                  (local_178->field_5).ql_link_active.qre_prev = (edata_t *)arena_01;
                  (arena_01->stats).resident = *(size_t *)((arena_01->stats).resident + 0x28);
                  (((local_178->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next
                       = local_178;
                  *(arena_t **)((arena_01->stats).resident + 0x28) = arena_01;
                }
                local_178 = (edata_t *)(arena_01->stats).metadata_rtree;
              }
            }
            else if ((uVar17 == 1) &&
                    ((arena_t *)(arena_00->stats).mutex_prof_data[0].tot_wait_time.ns != arena_01))
            {
              pbVar22 = bin_info;
              arena_bin_slabs_full_remove(arena,(bin_t *)arena_00,(edata_t *)arena_01);
              tsdn_00 = arena;
              arena_bin_lower_slab((tsdn_t *)arena,arena_01,(edata_t *)arena_00,pbVar22);
              pbVar22 = extraout_RDX_04;
            }
            plVar24 = plVar24 + 2;
            sVar18 = sVar18 - 1;
          } while (sVar18 != 0);
          local_1c8 = local_160 + local_158;
          sVar18 = local_158;
          local_180 = local_220;
        }
        paVar3 = &(arena_00->stats).pa_shard_stats.pac_stats.pac_mapped;
        paVar3->repr = paVar3->repr + 1;
        psVar1 = &(arena_00->stats).tcache_bytes;
        *psVar1 = *psVar1 + local_148;
        psVar1 = &(arena_00->stats).tcache_stashed_bytes;
        *psVar1 = *psVar1 + sVar18;
      }
    }
    bVar26 = false;
    do {
      if (nfill <= (ushort)uVar23) break;
      peVar11 = (edata_t *)(arena_00->stats).mutex_prof_data[0].tot_wait_time.ns;
      if ((peVar11 == (edata_t *)0x0) ||
         (uVar19 = peVar11->e_bits >> 0x1c, uVar17 = (uint)uVar19 & 0x3ff, (uVar19 & 0x3ff) == 0)) {
        _Var15 = arena_bin_refill_slabcur_no_fresh_slab((tsdn_t *)arena,arena_00,pbVar22);
        bVar13 = true;
        pbVar22 = extraout_RDX_06;
        if (_Var15) {
          if (local_230 == (edata_t *)0x0) {
            if (bVar14) {
              bVar26 = true;
            }
            local_230 = (edata_t *)0x0;
            bVar13 = false;
          }
          else {
            ppVar4 = &(arena_00->stats).pa_shard_stats.pac_stats.decay_muzzy;
            (ppVar4->npurge).val.repr = (ppVar4->npurge).val.repr + 1;
            plVar5 = &(arena_00->stats).pa_shard_stats.pac_stats.decay_muzzy.purged;
            (plVar5->val).repr = (plVar5->val).repr + 1;
            (arena_00->stats).mutex_prof_data[0].tot_wait_time.ns = (uint64_t)local_230;
            local_230 = (edata_t *)0x0;
          }
        }
      }
      else {
        cnt = (uint)nfill - (int)(uVar23 & 0xffff);
        if (uVar17 <= cnt) {
          cnt = uVar17;
        }
        arena_slab_reg_alloc_batch
                  (peVar11,(bin_info_t *)bin_info,cnt,
                   (void **)((long)ppvVar10 +
                            (uVar23 & 0xffff) * 8 +
                            ((ulong)(iVar9 - (int)ppvVar10 & 0xffff) -
                            (ulong)(uint)((int)CONCAT62(in_register_00000082,nfill) << 3))));
        uVar23 = (ulong)((int)uVar23 + cnt);
        bVar14 = true;
        bVar13 = true;
        pbVar22 = extraout_RDX_05;
      }
    } while (bVar13);
    if (!bVar26) {
      uVar21 = uVar23 & 0xffff;
      puVar2 = &(arena_00->stats).nflushes_large;
      *puVar2 = *puVar2 + uVar21;
      ppVar7 = &(arena_00->stats).pa_shard_stats;
      ppVar7->edata_avail = ppVar7->edata_avail + (cache_bin->tstats).nrequests;
      uVar20 = (arena_00->stats).pa_shard_stats.pac_stats.decay_dirty.npurge.val.repr + uVar21;
      (arena_00->stats).pa_shard_stats.pac_stats.decay_dirty.npurge.val.repr = uVar20;
      plVar5 = &(arena_00->stats).pa_shard_stats.pac_stats.decay_dirty.nmadvise;
      (plVar5->val).repr = (plVar5->val).repr + 1;
      (cache_bin->tstats).nrequests = 0;
      if (binind < duckdb_je_bin_info_nbatched_sizes) {
        puVar2 = &(arena_00->stats).nrequests_large;
        *puVar2 = *puVar2 + local_1c8;
        (arena_00->stats).pa_shard_stats.pac_stats.decay_dirty.npurge.val.repr = uVar20 - local_1c8;
      }
      *(undefined1 *)&(arena_00->stats).mapped = 0;
      pthread_mutex_unlock(__mutex);
      if (binind < duckdb_je_bin_info_nbatched_sizes) {
        uVar19 = (ulong)local_180;
        peVar11 = local_178;
        if (uVar19 != 0) {
          uVar25 = 0;
          do {
            duckdb_je_arena_slab_dalloc
                      (tsdn,(arena_t *)
                            duckdb_je_arenas[(uint)((edata_t *)auStack_1c0[uVar25])->e_bits & 0xfff]
                            .repr,(edata_t *)auStack_1c0[uVar25]);
            uVar25 = uVar25 + 1;
            peVar11 = local_178;
          } while (uVar19 != uVar25);
        }
        while (local_178 = peVar11, peVar11 != (edata_t *)0x0) {
          local_178 = (peVar11->field_5).ql_link_active.qre_next;
          if (local_178 == peVar11) {
            local_178 = (edata_t *)0x0;
          }
          else {
            (((peVar11->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next =
                 (((peVar11->field_5).ql_link_active.qre_next)->field_5).ql_link_active.qre_prev;
            (((peVar11->field_5).ql_link_active.qre_next)->field_5).ql_link_active.qre_prev =
                 (peVar11->field_5).ql_link_active.qre_prev;
            peVar12 = (peVar11->field_5).ql_link_active.qre_next;
            (peVar11->field_5).ql_link_active.qre_prev =
                 (((peVar11->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next;
            (((peVar12->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next =
                 peVar12;
            (((peVar11->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next =
                 peVar11;
          }
          duckdb_je_arena_slab_dalloc
                    (tsdn,(arena_t *)duckdb_je_arenas[(uint)peVar11->e_bits & 0xfff].repr,peVar11);
          peVar11 = local_178;
        }
      }
      if (local_230 != (edata_t *)0x0) {
        duckdb_je_arena_slab_dalloc(tsdn,arena,local_230);
      }
      ppvVar10 = cache_bin->stack_head;
      uVar17 = *(int *)&cache_bin->low_bits_empty - (int)ppvVar10 & 0xffff;
      if ((ushort)uVar23 < nfill) {
        uVar23 = (ulong)(uint)((int)uVar21 * 8);
        memmove((void *)((long)ppvVar10 + (uVar17 - uVar23)),
                (void *)((long)ppvVar10 + local_170 * 8 + (ulong)uVar17),uVar23);
      }
      cache_bin->stack_head =
           (void **)((long)ppvVar10 + ((ulong)uVar17 - (ulong)(uint)((int)uVar21 << 3)));
      if (tsdn != (tsdn_t *)0x0) {
        cVar8 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
        iVar9 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                .tick;
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
             iVar9 + -1;
        if (iVar9 < 1) {
          if (cVar8 < '\x01') {
            uVar21 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state *
                     0x5851f42d4c957f2d + 0x14057b7ef767814f;
            (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = uVar21;
            (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.
            tick = (int32_t)(((ulong)duckdb_je_ticker_geom_table[uVar21 >> 0x3a] *
                             (long)(tsdn->tsd).
                                   cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                                   .nticks) / 0x3d);
            duckdb_je_arena_decay(tsdn,arena,false,false);
            return;
          }
          (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick
               = 0;
        }
      }
      return;
    }
    if (binind < duckdb_je_bin_info_nbatched_sizes) {
      puVar2 = &(arena_00->stats).nrequests_large;
      *puVar2 = *puVar2 + local_1c8;
      ppVar6 = &(arena_00->stats).pa_shard_stats.pac_stats;
      (ppVar6->decay_dirty).npurge.val.repr = (ppVar6->decay_dirty).npurge.val.repr - local_1c8;
    }
    *(undefined1 *)&(arena_00->stats).mapped = 0;
    pthread_mutex_unlock(__mutex);
    if (binind < duckdb_je_bin_info_nbatched_sizes) {
      uVar19 = (ulong)local_180;
      peVar11 = local_178;
      if (uVar19 != 0) {
        uVar25 = 0;
        do {
          duckdb_je_arena_slab_dalloc
                    (tsdn,(arena_t *)
                          duckdb_je_arenas[(uint)((edata_t *)auStack_1c0[uVar25])->e_bits & 0xfff].
                          repr,(edata_t *)auStack_1c0[uVar25]);
          uVar25 = uVar25 + 1;
          peVar11 = local_178;
        } while (uVar19 != uVar25);
      }
      while (local_178 = peVar11, peVar11 != (edata_t *)0x0) {
        local_178 = (peVar11->field_5).ql_link_active.qre_next;
        if (local_178 == peVar11) {
          local_178 = (edata_t *)0x0;
        }
        else {
          (((peVar11->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next =
               (((peVar11->field_5).ql_link_active.qre_next)->field_5).ql_link_active.qre_prev;
          (((peVar11->field_5).ql_link_active.qre_next)->field_5).ql_link_active.qre_prev =
               (peVar11->field_5).ql_link_active.qre_prev;
          peVar12 = (peVar11->field_5).ql_link_active.qre_next;
          (peVar11->field_5).ql_link_active.qre_prev =
               (((peVar11->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next;
          (((peVar12->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar12;
          (((peVar11->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar11;
        }
        duckdb_je_arena_slab_dalloc
                  (tsdn,(arena_t *)duckdb_je_arenas[(uint)peVar11->e_bits & 0xfff].repr,peVar11);
        peVar11 = local_178;
      }
    }
    local_230 = arena_slab_alloc(tsdn,arena,binind,local_224,(bin_info_t *)bin_info);
    bVar14 = false;
  } while( true );
}

Assistant:

void
arena_cache_bin_fill_small(tsdn_t *tsdn, arena_t *arena,
    cache_bin_t *cache_bin, szind_t binind, const cache_bin_sz_t nfill) {
	assert(cache_bin_ncached_get_local(cache_bin) == 0);
	assert(nfill != 0);

	const bin_info_t *bin_info = &bin_infos[binind];

	CACHE_BIN_PTR_ARRAY_DECLARE(ptrs, nfill);
	cache_bin_init_ptr_array_for_fill(cache_bin, &ptrs, nfill);
	/*
	 * Bin-local resources are used first: 1) bin->slabcur, and 2) nonfull
	 * slabs.  After both are exhausted, new slabs will be allocated through
	 * arena_slab_alloc().
	 *
	 * Bin lock is only taken / released right before / after the while(...)
	 * refill loop, with new slab allocation (which has its own locking)
	 * kept outside of the loop.  This setup facilitates flat combining, at
	 * the cost of the nested loop (through goto label_refill).
	 *
	 * To optimize for cases with contention and limited resources
	 * (e.g. hugepage-backed or non-overcommit arenas), each fill-iteration
	 * gets one chance of slab_alloc, and a retry of bin local resources
	 * after the slab allocation (regardless if slab_alloc failed, because
	 * the bin lock is dropped during the slab allocation).
	 *
	 * In other words, new slab allocation is allowed, as long as there was
	 * progress since the previous slab_alloc.  This is tracked with
	 * made_progress below, initialized to true to jump start the first
	 * iteration.
	 *
	 * In other words (again), the loop will only terminate early (i.e. stop
	 * with filled < nfill) after going through the three steps: a) bin
	 * local exhausted, b) unlock and slab_alloc returns null, c) re-lock
	 * and bin local fails again.
	 */
	bool made_progress = true;
	edata_t *fresh_slab = NULL;
	bool alloc_and_retry = false;
	cache_bin_sz_t filled = 0;
	unsigned binshard;
	bin_t *bin = arena_bin_choose(tsdn, arena, binind, &binshard);

	/*
	 * This has some fields that are conditionally initialized down batch
	 * flush pathways.  This can trigger static analysis warnings deeper
	 * down in the static.  The accesses are guarded by the same checks as
	 * the initialization, but the analysis isn't able to track that across
	 * multiple stack frames.
	 */
	arena_bin_flush_batch_state_t batch_flush_state
	    JEMALLOC_CLANG_ANALYZER_SILENCE_INIT({0});
label_refill:
	malloc_mutex_lock(tsdn, &bin->lock);
	arena_bin_flush_batch_after_lock(tsdn, arena, bin, binind, &batch_flush_state);

	while (filled < nfill) {
		/* Try batch-fill from slabcur first. */
		edata_t *slabcur = bin->slabcur;
		if (slabcur != NULL && edata_nfree_get(slabcur) > 0) {
			unsigned tofill = nfill - filled;
			unsigned nfree = edata_nfree_get(slabcur);
			unsigned cnt = tofill < nfree ? tofill : nfree;

			arena_slab_reg_alloc_batch(slabcur, bin_info, cnt,
			    &ptrs.ptr[filled]);
			made_progress = true;
			filled += cnt;
			continue;
		}
		/* Next try refilling slabcur from nonfull slabs. */
		if (!arena_bin_refill_slabcur_no_fresh_slab(tsdn, arena, bin)) {
			assert(bin->slabcur != NULL);
			continue;
		}

		/* Then see if a new slab was reserved already. */
		if (fresh_slab != NULL) {
			arena_bin_refill_slabcur_with_fresh_slab(tsdn, arena,
			    bin, binind, fresh_slab);
			assert(bin->slabcur != NULL);
			fresh_slab = NULL;
			continue;
		}

		/* Try slab_alloc if made progress (or never did slab_alloc). */
		if (made_progress) {
			assert(bin->slabcur == NULL);
			assert(fresh_slab == NULL);
			alloc_and_retry = true;
			/* Alloc a new slab then come back. */
			break;
		}

		/* OOM. */

		assert(fresh_slab == NULL);
		assert(!alloc_and_retry);
		break;
	} /* while (filled < nfill) loop. */

	if (config_stats && !alloc_and_retry) {
		bin->stats.nmalloc += filled;
		bin->stats.nrequests += cache_bin->tstats.nrequests;
		bin->stats.curregs += filled;
		bin->stats.nfills++;
		cache_bin->tstats.nrequests = 0;
	}

	arena_bin_flush_batch_before_unlock(tsdn, arena, bin, binind,
	    &batch_flush_state);
	malloc_mutex_unlock(tsdn, &bin->lock);
	arena_bin_flush_batch_after_unlock(tsdn, arena, bin, binind,
	    &batch_flush_state);

	if (alloc_and_retry) {
		assert(fresh_slab == NULL);
		assert(filled < nfill);
		assert(made_progress);

		fresh_slab = arena_slab_alloc(tsdn, arena, binind, binshard,
		    bin_info);
		/* fresh_slab NULL case handled in the for loop. */

		alloc_and_retry = false;
		made_progress = false;
		goto label_refill;
	}
	assert(filled == nfill || (fresh_slab == NULL && !made_progress));

	/* Release if allocated but not used. */
	if (fresh_slab != NULL) {
		assert(edata_nfree_get(fresh_slab) == bin_info->nregs);
		arena_slab_dalloc(tsdn, arena, fresh_slab);
		fresh_slab = NULL;
	}

	cache_bin_finish_fill(cache_bin, &ptrs, filled);
	arena_decay_tick(tsdn, arena);
}